

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O1

Sexp * Builtin_Error(Sexp *form)

{
  Kind KVar1;
  undefined8 *puVar2;
  ContractFrameProtector local_70;
  ContractFrameProtector __contract_frame;
  undefined8 local_60;
  undefined1 local_58 [16];
  ContractFrame *local_48;
  undefined8 local_40;
  undefined1 local_38 [24];
  
  ContractFrameProtector::ContractFrameProtector(&local_70,"Builtin_Error");
  ContractFrame::AddContract(local_70.protected_frame,NoGc);
  KVar1 = form->kind;
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  if (KVar1 == STRING) {
    std::__cxx11::string::string
              ((string *)&__contract_frame,(form->field_1).string_value,
               (allocator *)(local_38 + 0x17));
    *puVar2 = &PTR__JetRuntimeException_00126918;
    puVar2[1] = puVar2 + 3;
    if (__contract_frame.protected_frame == (ContractFrame *)local_58) {
      *(undefined4 *)(puVar2 + 3) = local_58._0_4_;
      *(undefined4 *)((long)puVar2 + 0x1c) = local_58._4_4_;
      *(undefined4 *)(puVar2 + 4) = local_58._8_4_;
      *(undefined4 *)((long)puVar2 + 0x24) = local_58._12_4_;
    }
    else {
      puVar2[1] = __contract_frame.protected_frame;
      puVar2[3] = CONCAT44(local_58._4_4_,local_58._0_4_);
    }
    puVar2[2] = local_60;
    local_58._0_4_ = local_58._0_4_ & 0xffffff00;
    __contract_frame.protected_frame = (ContractFrame *)local_58;
    __cxa_throw(puVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  local_48 = (ContractFrame *)local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"error called with non-string value","");
  *puVar2 = &PTR__JetRuntimeException_00126918;
  puVar2[1] = puVar2 + 3;
  if (local_48 == (ContractFrame *)local_38) {
    *(undefined4 *)(puVar2 + 3) = local_38._0_4_;
    *(undefined4 *)((long)puVar2 + 0x1c) = local_38._4_4_;
    *(undefined4 *)(puVar2 + 4) = local_38._8_4_;
    *(undefined4 *)((long)puVar2 + 0x24) = local_38._12_4_;
  }
  else {
    puVar2[1] = local_48;
    puVar2[3] = CONCAT44(local_38._4_4_,local_38._0_4_);
  }
  puVar2[2] = local_40;
  local_40 = 0;
  local_38._0_4_ = local_38._0_4_ & 0xffffff00;
  local_48 = (ContractFrame *)local_38;
  __cxa_throw(puVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *Builtin_Error(Sexp *form) {
  CONTRACT { FORBID_GC; }